

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gc_function.h
# Opt level: O3

value * __thiscall
mjs::gc_function::
impl<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/mras0[P]mjs/src/mjs/array_object.cpp:561:57)>
::call(value *__return_storage_ptr__,
      impl<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_mras0[P]mjs_src_mjs_array_object_cpp:561:57)>
      *this,value *this_,vector<mjs::value,_std::allocator<mjs::value>_> *args)

{
  bool bVar1;
  uint32_t uVar2;
  value *pvVar3;
  undefined8 *puVar4;
  undefined4 extraout_var;
  uint *puVar5;
  object *this_00;
  long *plVar6;
  long *plVar7;
  uint32_t index;
  undefined8 extraout_RDX;
  undefined8 uVar8;
  undefined8 extraout_RDX_00;
  uint uVar9;
  anon_class_16_1_570cf4e1_for_f *this_01;
  anon_union_32_5_7b1e0779_for_value_3 *this_02;
  string last_idx;
  string this_idx;
  undefined1 local_b8 [40];
  undefined1 local_90 [16];
  value *local_80;
  undefined8 local_78;
  wstring_view local_70;
  gc_heap_ptr_untyped *local_60;
  gc_heap *local_58;
  wstring_view local_50;
  
  this_01 = &this->f;
  local_80 = __return_storage_ptr__;
  pvVar3 = (value *)gc_heap_ptr_untyped::get((gc_heap_ptr_untyped *)this_01);
  global_object::validate_object((global_object *)&stack0xffffffffffffffc0,pvVar3);
  gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)&stack0xffffffffffffffc0);
  if (this_->type_ == object) {
    this_02 = &this_->field_1;
    local_58 = (this_01->global).super_gc_heap_ptr_untyped.heap_;
    local_60 = (gc_heap_ptr_untyped *)this_01;
    puVar4 = (undefined8 *)gc_heap_ptr_untyped::get((gc_heap_ptr_untyped *)&this_02->s_);
    local_90._0_8_ = (gc_heap *)0x6;
    local_90._8_8_ = L"length";
    (**(code **)*puVar4)(local_b8);
    uVar2 = to_uint32((value *)local_b8);
    local_78 = CONCAT44(extraout_var,uVar2);
    value::destroy((value *)local_b8);
    if ((uint)local_78 == 0) {
      plVar6 = (long *)gc_heap_ptr_untyped::get((gc_heap_ptr_untyped *)&this_02->s_);
      plVar7 = (long *)gc_heap_ptr_untyped::get(local_60);
      (**(code **)(*plVar7 + 0x98))(local_90,plVar7,"length");
      local_b8._0_4_ = number;
      local_b8._8_8_ = 0.0;
      (**(code **)(*plVar6 + 8))(plVar6,local_90,local_b8,0);
      value::destroy((value *)local_b8);
      gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)local_90);
      pvVar3 = local_80;
      value::value(local_80,(value *)&value::undefined);
    }
    else {
      index_string_abi_cxx11_((wstring *)local_b8,(mjs *)0x0,index);
      local_70._M_len = local_b8._8_8_;
      local_70._M_str = (wchar_t *)local_b8._0_8_;
      string::string((string *)local_90,local_58,&local_70);
      if ((undefined1 *)local_b8._0_8_ != local_b8 + 0x10) {
        operator_delete((void *)local_b8._0_8_,local_b8._16_8_ * 4 + 4);
      }
      puVar4 = (undefined8 *)gc_heap_ptr_untyped::get((gc_heap_ptr_untyped *)&this_02->s_);
      puVar5 = (uint *)gc_heap_ptr_untyped::get((gc_heap_ptr_untyped *)local_90);
      local_b8._8_8_ = puVar5 + 1;
      local_b8._0_8_ = ZEXT48(*puVar5);
      (**(code **)*puVar4)(local_80,puVar4);
      if ((uint)local_78 != 1) {
        uVar9 = 1;
        uVar8 = extraout_RDX;
        do {
          index_string_abi_cxx11_((wstring *)local_b8,(mjs *)(ulong)uVar9,(uint32_t)uVar8);
          local_50._M_len = local_b8._8_8_;
          local_50._M_str = (wchar_t *)local_b8._0_8_;
          string::string((string *)&local_70,local_58,&local_50);
          if ((undefined1 *)local_b8._0_8_ != local_b8 + 0x10) {
            operator_delete((void *)local_b8._0_8_,local_b8._16_8_ * 4 + 4);
          }
          this_00 = (object *)gc_heap_ptr_untyped::get((gc_heap_ptr_untyped *)&this_02->s_);
          puVar5 = (uint *)gc_heap_ptr_untyped::get((gc_heap_ptr_untyped *)&local_70);
          local_b8._8_8_ = puVar5 + 1;
          local_b8._0_8_ = ZEXT48(*puVar5);
          bVar1 = object::has_property(this_00,(wstring_view *)local_b8);
          if (bVar1) {
            plVar6 = (long *)gc_heap_ptr_untyped::get((gc_heap_ptr_untyped *)&this_02->s_);
            puVar4 = (undefined8 *)gc_heap_ptr_untyped::get((gc_heap_ptr_untyped *)&this_02->s_);
            puVar5 = (uint *)gc_heap_ptr_untyped::get((gc_heap_ptr_untyped *)&local_70);
            local_50._M_str = (wchar_t *)(puVar5 + 1);
            local_50._M_len = (size_t)*puVar5;
            (**(code **)*puVar4)(local_b8,puVar4,&local_50);
            (**(code **)(*plVar6 + 8))(plVar6,local_90,local_b8,0);
            value::destroy((value *)local_b8);
          }
          else {
            plVar6 = (long *)gc_heap_ptr_untyped::get((gc_heap_ptr_untyped *)&this_02->s_);
            puVar5 = (uint *)gc_heap_ptr_untyped::get((gc_heap_ptr_untyped *)local_90);
            local_b8._8_8_ = puVar5 + 1;
            local_b8._0_8_ = ZEXT48(*puVar5);
            (**(code **)(*plVar6 + 0x10))(plVar6,local_b8);
          }
          gc_heap_ptr_untyped::operator=
                    ((gc_heap_ptr_untyped *)local_90,(gc_heap_ptr_untyped *)&local_70);
          gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)&local_70);
          uVar9 = uVar9 + 1;
          uVar8 = extraout_RDX_00;
        } while ((uint)local_78 != uVar9);
      }
      plVar6 = (long *)gc_heap_ptr_untyped::get((gc_heap_ptr_untyped *)&this_02->s_);
      plVar7 = (long *)gc_heap_ptr_untyped::get(local_60);
      (**(code **)(*plVar7 + 0x98))(&local_70,plVar7,"length");
      local_b8._8_8_ = (undefined8)((int)local_78 - 1);
      local_b8._0_4_ = number;
      (**(code **)(*plVar6 + 8))(plVar6,&local_70,local_b8,0);
      value::destroy((value *)local_b8);
      gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)&local_70);
      gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)local_90);
      pvVar3 = local_80;
    }
    return pvVar3;
  }
  __assert_fail("type_ == value_type::object",
                "/workspace/llm4binary/github/license_c_cmakelists/mras0[P]mjs/src/mjs/value.h",0x46
                ,"const object_ptr &mjs::value::object_value() const");
}

Assistant:

value call(const value& this_, const std::vector<value>& args) override { return f(this_, args); }